

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply.c
# Opt level: O0

void use_magic_whistle(obj *obj)

{
  monst *pmVar1;
  boolean bVar2;
  int iVar3;
  obj *poVar4;
  char *pcVar5;
  bool bVar6;
  int pet_cnt;
  monst *nextmon;
  monst *mtmp;
  obj *obj_local;
  
  if (((*(uint *)&obj->field_0x4a & 1) == 0) || (iVar3 = rn2(2), iVar3 != 0)) {
    bVar6 = false;
    if (u.uprops[0x23].intrinsic != 0) {
      bVar6 = true;
      if ((u.uprops[0x24].extrinsic == 0) && (bVar6 = false, u.umonnum != u.umonster)) {
        bVar2 = dmgtype(youmonst.data,0x24);
        bVar6 = bVar2 != '\0';
      }
      bVar6 = (bool)(bVar6 ^ 1);
    }
    pcVar5 = "strange";
    if (bVar6) {
      pcVar5 = "normal";
    }
    pline("You produce a %s whistling sound.",pcVar5);
    pmVar1 = level->monlist;
    while (nextmon = pmVar1, nextmon != (monst *)0x0) {
      pmVar1 = nextmon->nmon;
      if ((0 < nextmon->mhp) && (nextmon->mtame != '\0')) {
        if ((*(uint *)&nextmon->field_0x60 >> 0x17 & 1) != 0) {
          *(uint *)&nextmon->field_0x60 = *(uint *)&nextmon->field_0x60 & 0xff7fffff;
          fill_pit(level,(int)nextmon->mx,(int)nextmon->my);
        }
        mnexto(nextmon);
        if (nextmon->wormno == '\0') {
          if (((viz_array[nextmon->my][nextmon->mx] & 2U) != 0) ||
             (((((u.uprops[0x1e].intrinsic == 0 &&
                 (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
                  (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
                ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
               ((u.uprops[0x40].intrinsic != 0 ||
                ((u.uprops[0x40].extrinsic != 0 || (((youmonst.data)->mflags3 & 0x100) != 0)))))) &&
              (((nextmon->data->mflags3 & 0x200) != 0 &&
               ((viz_array[nextmon->my][nextmon->mx] & 1U) != 0)))))) goto LAB_0014ebca;
LAB_0014ec57:
          if (((((nextmon->data->mflags1 & 0x10000) != 0) ||
               ((poVar4 = which_armor(nextmon,4), poVar4 != (obj *)0x0 &&
                (poVar4 = which_armor(nextmon,4), poVar4->otyp == 0x4f)))) ||
              (((((u.uprops[0x1e].intrinsic == 0 &&
                  (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
                   (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
                 (((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')) ||
                  ((((u.uprops[0x19].intrinsic == 0 &&
                     ((u.uprops[0x19].extrinsic == 0 && (youmonst.data != mons + 0x1e)))) &&
                    (youmonst.data != mons + 0x31)) && (youmonst.data != mons + 0x32)))))) ||
                (u.uprops[0x19].blocked != 0)) &&
               (((u.uprops[0x19].extrinsic == 0 || (u.uprops[0x19].blocked != 0)) ||
                (iVar3 = dist2((int)nextmon->mx,(int)nextmon->my,(int)u.ux,(int)u.uy), 0x40 < iVar3)
                ))))) && ((u.uprops[0x42].intrinsic == 0 && (u.uprops[0x42].extrinsic == 0)))) {
            match_warn_of_mon(nextmon);
          }
        }
        else {
          bVar2 = worm_known(level,nextmon);
          if (bVar2 == '\0') goto LAB_0014ec57;
LAB_0014ebca:
          if (((((((*(uint *)&nextmon->field_0x60 >> 1 & 1) != 0) && (u.uprops[0xc].intrinsic == 0))
                && (u.uprops[0xc].extrinsic == 0)) && (((youmonst.data)->mflags1 & 0x1000000) == 0))
              || (((*(uint *)&nextmon->field_0x60 >> 7 & 1) != 0 ||
                  ((*(uint *)&nextmon->field_0x60 >> 9 & 1) != 0)))) ||
             (((byte)u._1052_1_ >> 5 & 1) != 0)) goto LAB_0014ec57;
        }
        iVar3 = mintrap(nextmon);
        if (iVar3 == 2) {
          change_luck(-1);
        }
      }
    }
  }
  else {
    pline("You produce a high-pitched humming noise.");
    wake_nearby();
  }
  makeknown_msg((int)obj->otyp);
  return;
}

Assistant:

static void use_magic_whistle(struct obj *obj)
{
	struct monst *mtmp, *nextmon;

	if (obj->cursed && !rn2(2)) {
		pline("You produce a high-pitched humming noise.");
		wake_nearby();
	} else {
		int pet_cnt = 0;
		pline(whistle_str, Hallucination ? "normal" : "strange");
		for (mtmp = level->monlist; mtmp; mtmp = nextmon) {
		    nextmon = mtmp->nmon; /* trap might kill mon */
		    if (DEADMONSTER(mtmp)) continue;
		    if (mtmp->mtame) {
			if (mtmp->mtrapped) {
			    /* no longer in previous trap (affects mintrap) */
			    mtmp->mtrapped = 0;
			    fill_pit(level, mtmp->mx, mtmp->my);
			}
			mnexto(mtmp);
			if (canspotmon(level, mtmp)) ++pet_cnt;
			if (mintrap(mtmp) == 2) change_luck(-1);
		    }
		}
	}
	makeknown_msg(obj->otyp);
}